

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O3

void __thiscall CfgNode::setData(CfgNode *this,Data *data)

{
  Data *pDVar1;
  
  if (data == (Data *)0x0) {
    __assert_fail("data != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                  ,0x28,"void CfgNode::setData(CfgNode::Data *)");
  }
  pDVar1 = (Data *)__dynamic_cast(data,&Data::typeinfo,&PhantomData::typeinfo,0);
  if (pDVar1 == (Data *)0x0) {
    pDVar1 = (Data *)__dynamic_cast(data,&Data::typeinfo,&BlockData::typeinfo,0);
    if (pDVar1 == (Data *)0x0) {
LAB_001065ce:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0x45,"void CfgNode::setData(CfgNode::Data *)");
    }
    if (this->m_type == CFG_BLOCK) {
      if (this->m_data != (Data *)0x0) {
        __assert_fail("m_data == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                      ,0x3d,"void CfgNode::setData(CfgNode::Data *)");
      }
    }
    else {
      if (this->m_type != CFG_PHANTOM) goto LAB_001065ce;
      if (this->m_data == (Data *)0x0) {
        __assert_fail("m_data != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                      ,0x36,"void CfgNode::setData(CfgNode::Data *)");
      }
      (*this->m_data->_vptr_Data[1])();
      this->m_type = CFG_BLOCK;
    }
    this->m_data = pDVar1;
  }
  else {
    if (this->m_data != (Data *)0x0) {
      __assert_fail("m_data == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0x2c,"void CfgNode::setData(CfgNode::Data *)");
    }
    if (this->m_type != CFG_PHANTOM) {
      __assert_fail("m_type == CfgNode::CFG_PHANTOM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0x2d,"void CfgNode::setData(CfgNode::Data *)");
    }
    this->m_data = pDVar1;
  }
  return;
}

Assistant:

void CfgNode::setData(CfgNode::Data* data) {
	assert(data != 0);

	PhantomData* phantomData = dynamic_cast<PhantomData*>(data);
	if (phantomData) {
		assert(m_data == 0);
		assert(m_type == CfgNode::CFG_PHANTOM);
		m_data = phantomData;
		return;
	}

	BlockData* blockData = dynamic_cast<BlockData*>(data);
	if (blockData) {
		switch (m_type) {
			case CfgNode::CFG_PHANTOM:
				assert(m_data != 0);
				delete m_data;

				m_type = CfgNode::CFG_BLOCK;
				m_data = blockData;
				return;
			case CfgNode::CFG_BLOCK:
				assert(m_data == 0);
				m_data = blockData;
				return;
			default:
				break;
		}
	}

	assert(false);
}